

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O2

void __thiscall FTeam::ParseTeamDefinition(FTeam *this,FScanner *Scan)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FTeam Team;
  
  Team.m_Name.Chars = FString::NullString.Nothing;
  Team.m_TextColor.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  Team.m_Logo.Chars = FString::NullString.Nothing;
  Team.m_iPlayerColor = 0;
  Team.m_bAllowCustomPlayerColor = false;
  Team.m_iPlayerCount = 0;
  Team.m_iScore = 0;
  Team.m_iPresent = 0;
  Team.m_iTies = 0;
  FScanner::MustGetString(Scan);
  FString::operator=(&Team.m_Name,Scan->String);
  FScanner::MustGetStringName(Scan,"{");
  iVar1 = -1;
  while (iVar4 = iVar1, bVar2 = FScanner::CheckString(Scan,"}"), !bVar2) {
    FScanner::MustGetString(Scan);
    iVar3 = FScanner::MatchString(Scan,TeamInfoOptions,8);
    iVar1 = iVar4;
    switch(iVar3) {
    case 0:
      FScanner::MustGetString(Scan);
      bVar2 = FScanner::Compare(Scan,"Any");
      iVar1 = 1;
      if (!bVar2) {
        bVar2 = CheckGame(Scan->String,false);
        iVar1 = 1;
        if ((!bVar2) && (iVar1 = iVar4, iVar4 == -1)) {
          iVar1 = 0;
        }
      }
      break;
    case 1:
      FScanner::MustGetString(Scan);
      Team.m_iPlayerColor = V_GetColor((DWORD *)0x0,Scan);
      break;
    case 2:
      FScanner::MustGetString(Scan);
      FString::AppendFormat(&Team.m_TextColor,"[%s]",Scan->String);
      break;
    case 3:
      FScanner::MustGetString(Scan);
      FString::operator=(&Team.m_Logo,Scan->String);
      break;
    case 4:
      Team.m_bAllowCustomPlayerColor = true;
      break;
    case 5:
    case 6:
    case 7:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
      FScanner::MustGetString(Scan);
      break;
    case 8:
      FScanner::MustGetNumber(Scan);
      break;
    default:
      FScanner::ScriptError(Scan,"ParseTeamDefinition: Unknown team option \'%s\'.\n",Scan->String);
    }
  }
  if (iVar4 != 0) {
    TArray<FTeam,_FTeam>::Push(&Teams,&Team);
  }
  ~FTeam(&Team);
  return;
}

Assistant:

void FTeam::ParseTeamInfo ()
{
	int iLump, iLastLump = 0;

	Teams.Clear();
	while ((iLump = Wads.FindLump ("TEAMINFO", &iLastLump)) != -1)
	{
		FScanner Scan (iLump);

		while (Scan.GetString ())
		{
			if (Scan.Compare ("ClearTeams"))
				ClearTeams ();
			else if (Scan.Compare ("Team"))
				ParseTeamDefinition (Scan);
			else
				Scan.ScriptError ("ParseTeamInfo: Unknown team command '%s'.\n", Scan.String);
		}
	}

	if (Teams.Size () < 2)
		I_FatalError ("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
	else if (Teams.Size () > (unsigned)TEAM_MAXIMUM)
		I_FatalError ("ParseTeamInfo: Too many teams defined. (Maximum: %d)", TEAM_MAXIMUM);
}